

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  ImDrawList *draw_list;
  ImVec2 IVar3;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  ImGuiWindow *pIVar6;
  char *pcVar7;
  bool bVar8;
  ImS8 IVar9;
  short sVar10;
  ImU32 id;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ImU32 col;
  ImGuiID close_button_id;
  bool *pbVar14;
  ImGuiTabItem *pIVar15;
  size_t sVar16;
  undefined8 extraout_RAX;
  char *pcVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  ImGuiTabItem *pIVar21;
  ImGuiCol idx;
  undefined1 uVar22;
  uint uVar23;
  int iVar24;
  bool is_contents_visible;
  float fVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar26;
  bool text_clipped;
  bool just_closed;
  undefined4 local_a4;
  ImGuiWindow *local_a0;
  ImRect bb;
  bool hovered;
  undefined7 uStack_67;
  float fStack_64;
  bool held;
  float local_5c;
  undefined1 local_58 [4];
  undefined1 auStack_54 [12];
  char *local_48;
  ImGuiContext *local_40;
  int local_38;
  int local_34;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar5 = GImGui;
  local_a0 = GImGui->CurrentWindow;
  if (local_a0->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return false;
  }
  local_40 = pIVar5;
  pbVar14 = (bool *)0x0;
  uVar23 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    pbVar14 = p_open;
    uVar23 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar23 = flags;
  }
  local_48 = label;
  IVar3 = TabItemCalcSize(label,pbVar14 != (bool *)0x0);
  local_58 = (undefined1  [4])IVar3.x;
  auStack_54._0_4_ = IVar3.y;
  uVar11 = (tab_bar->Tabs).Size;
  auStack_54._4_4_ = extraout_XMM0_Dc;
  auStack_54._8_4_ = extraout_XMM0_Dd;
  if (0 < (int)uVar11 && id != 0) {
    pIVar15 = (tab_bar->Tabs).Data;
    lVar20 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar15->ID + lVar20) == id) {
        pIVar21 = (ImGuiTabItem *)((long)&pIVar15->ID + lVar20);
        local_a4 = 0;
        goto LAB_00164682;
      }
      lVar20 = lVar20 + 0x24;
    } while ((ulong)uVar11 * 0x24 != lVar20);
  }
  if (uVar11 == (tab_bar->Tabs).Capacity) {
    local_58 = (undefined1  [4])IVar3.x;
    auStack_54._0_4_ = IVar3.y;
    if (uVar11 == 0) {
      iVar18 = 8;
    }
    else {
      iVar18 = (int)uVar11 / 2 + uVar11;
    }
    iVar19 = uVar11 + 1;
    if ((int)(uVar11 + 1) < iVar18) {
      iVar19 = iVar18;
    }
    pIVar15 = (ImGuiTabItem *)MemAlloc((long)iVar19 * 0x24);
    pIVar21 = (tab_bar->Tabs).Data;
    if (pIVar21 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar15,pIVar21,(long)(tab_bar->Tabs).Size * 0x24);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar15;
    (tab_bar->Tabs).Capacity = iVar19;
    uVar11 = (tab_bar->Tabs).Size;
  }
  else {
    pIVar15 = (tab_bar->Tabs).Data;
  }
  pIVar15[(int)uVar11].ID = 0;
  pIVar15[(int)uVar11].Flags = 0;
  pIVar15[(int)uVar11].LastFrameVisible = -1;
  pIVar15[(int)uVar11].LastFrameSelected = -1;
  pIVar15[(int)uVar11].Offset = 0.0;
  pIVar15[(int)uVar11].Width = 0.0;
  pIVar15[(int)uVar11].ContentWidth = 0.0;
  pIVar15 = pIVar15 + (int)uVar11;
  pIVar15->NameOffset = -1;
  pIVar15->BeginOrder = -1;
  pIVar15->IndexDuringLayout = -1;
  pIVar15->WantClose = false;
  pIVar15->field_0x23 = 0;
  lVar20 = (long)(tab_bar->Tabs).Size;
  (tab_bar->Tabs).Size = (int)(lVar20 + 1);
  pIVar15 = (tab_bar->Tabs).Data;
  pIVar21 = pIVar15 + lVar20;
  pIVar21->ID = id;
  pIVar15[lVar20].Width = (float)local_58;
  tab_bar->TabsAddedNew = true;
  local_a4 = (undefined4)CONCAT71((int7)((ulong)((lVar20 + 1) * 9) >> 8),1);
LAB_00164682:
  pcVar7 = local_48;
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar21 - (int)pIVar15) >> 2) * -0x71c7;
  pIVar21->ContentWidth = (float)local_58;
  sVar10 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar10 + 1;
  uVar11 = uVar23 | 0x100000;
  if (pbVar14 != (bool *)0x0) {
    uVar11 = uVar23;
  }
  pIVar21->BeginOrder = sVar10;
  uVar23 = tab_bar->Flags;
  iVar12 = tab_bar->PrevFrameVisible + 1;
  iVar18 = local_40->FrameCount;
  iVar24 = pIVar21->LastFrameVisible + 1;
  pIVar21->LastFrameVisible = iVar18;
  pIVar21->Flags = uVar11;
  iVar19 = (tab_bar->TabsNames).Buf.Size;
  sVar10 = (short)iVar19 + -1;
  if (iVar19 == 0) {
    sVar10 = 0;
  }
  pIVar21->NameOffset = sVar10;
  sVar16 = strlen(local_48);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar7,pcVar7 + sVar16 + 1);
  pIVar5 = local_40;
  if (((iVar24 < iVar18) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar12 < iVar18) {
      if ((uVar11 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_00164766;
    }
    else if ((uVar11 >> 0x15 & 1) == 0) {
LAB_00164766:
      tab_bar->NextSelectedTabId = id;
    }
  }
  if ((((uVar11 & 2) != 0) && (tab_bar->SelectedTabId != id)) && ((uVar11 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    is_contents_visible = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar12 < iVar18) && ((tab_bar->Tabs).Size == 1)) {
    is_contents_visible = (tab_bar->Flags & 2) == 0;
  }
  else {
    is_contents_visible = false;
  }
  if ((((byte)local_a4 | iVar18 <= iVar12) & iVar24 < iVar18) == 1) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return (bool)((uVar11 >> 0x15 & 1) == 0 & is_contents_visible);
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar21->LastFrameSelected = local_40->FrameCount;
  }
  uVar13 = pIVar21->Flags;
  fVar2 = pIVar21->Width;
  fVar25 = pIVar21->Offset;
  if ((uVar13 & 0xc0) == 0) {
    fVar25 = (float)(int)(fVar25 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar25 + (tab_bar->BarRect).Min.x;
  IVar3 = (local_a0->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar26.y = bb.Min.y;
  IVar26.x = bb.Min.x;
  (local_a0->DC).CursorPos = IVar26;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = (float)auStack_54._0_4_ + bb.Min.y;
  local_38 = iVar24;
  local_34 = iVar18;
  if ((uVar13 & 0xc0) == 0) {
    fVar2 = tab_bar->ScrollingRectMinX;
    if ((fVar2 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_001648c6;
    fStack_64 = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      (uint)bb.Min.x & -(uint)(fVar2 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_5c = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    local_58 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_001648c6:
    auVar4._12_4_ = 0;
    auVar4._0_12_ = auStack_54;
    _local_58 = auVar4 << 0x20;
  }
  pIVar6 = local_a0;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_64 = bb.Max.y - bb.Min.y;
  IVar26 = (local_a0->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(pIVar5->Style).FramePadding.y);
  (pIVar6->DC).CursorMaxPos = IVar26;
  bVar8 = ItemAdd(&bb,id,(ImRect *)0x0);
  if (!bVar8) {
    if (local_58[0] != '\0') {
      PopClipRect();
    }
    (local_a0->DC).CursorPos = IVar3;
    return is_contents_visible;
  }
  uVar13 = uVar11 & 0x200000;
  bVar8 = ButtonBehavior(&bb,id,&hovered,&held,
                         (uVar13 >> 0x11) + (uint)pIVar5->DragDropActive * 0x200 + 0x1010);
  local_a4 = CONCAT31(local_a4._1_3_,bVar8);
  if ((bVar8) && (uVar13 == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  hovered = (bool)(hovered | pIVar5->HoveredId == id);
  if (pIVar5->ActiveId != id) {
    SetItemAllowOverlap();
  }
  if ((((held == true) && (local_34 <= local_38)) && (bVar8 = IsMouseDragging(0,-1.0), bVar8)) &&
     ((pIVar5->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) {
    fVar2 = (pIVar5->IO).MouseDelta.x;
    if (fVar2 < 0.0) {
      IVar9 = -1;
      pIVar1 = &(pIVar5->IO).MousePos;
      if (bb.Min.x < pIVar1->x || bb.Min.x == pIVar1->x) goto LAB_001649e8;
LAB_001649ff:
      tab_bar->ReorderRequestTabId = pIVar21->ID;
      tab_bar->ReorderRequestDir = IVar9;
    }
    else {
LAB_001649e8:
      if (0.0 < fVar2) {
        IVar9 = '\x01';
        if (bb.Max.x < (pIVar5->IO).MousePos.x) goto LAB_001649ff;
      }
    }
  }
  draw_list = local_a0->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (is_contents_visible == false) {
      idx = (uint)((uVar23 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar23 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,uVar11,col);
  RenderNavHighlight((ImGui *)&bb,(ImRect *)(ulong)id,1,col);
  bVar8 = IsItemHovered(8);
  if (bVar8) {
    bVar8 = IsMouseClicked(1,false);
    if (bVar8) {
      uVar13 = uVar11 >> 0x15 & 1;
    }
    else {
      bVar8 = IsMouseReleased(1);
      if (!bVar8) goto LAB_00164b53;
    }
    if (uVar13 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_00164b53:
  uVar23 = tab_bar->Flags;
  if (pbVar14 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar23 >> 1 & 4 | uVar11,tab_bar->FramePadding,local_48,id,
             close_button_id,is_contents_visible,&just_closed,&text_clipped);
  pIVar5 = local_40;
  if ((pbVar14 != (bool *)0x0) && (just_closed != false)) {
    *pbVar14 = false;
    if ((pIVar21->Flags & 1) == 0) {
      pIVar21->WantClose = true;
      if (tab_bar->VisibleTabId == pIVar21->ID) {
        pIVar21->LastFrameVisible = -1;
        tab_bar->SelectedTabId = 0;
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else if (tab_bar->VisibleTabId != pIVar21->ID) {
      tab_bar->NextSelectedTabId = pIVar21->ID;
    }
  }
  if (local_58[0] != '\0') {
    PopClipRect();
  }
  (local_a0->DC).CursorPos = IVar3;
  if ((((text_clipped == true) && (pIVar5->HoveredId == id)) && (held == false)) &&
     (((pIVar5->TooltipSlowDelay <= pIVar5->HoveredIdNotActiveTimer &&
        pIVar5->HoveredIdNotActiveTimer != pIVar5->TooltipSlowDelay &&
       (bVar8 = IsItemHovered(0), pcVar7 = local_48, bVar8)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((pIVar21->Flags & 0x10) == 0)))))) {
    pcVar17 = FindRenderedTextEnd(local_48,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar17 - (int)pcVar7),pcVar7);
  }
  uVar22 = (char)local_a4;
  if ((uVar11 >> 0x15 & 1) == 0) {
    uVar22 = is_contents_visible;
  }
  return (bool)uVar22;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS16)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}